

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.hpp
# Opt level: O0

void __thiscall msgpack::v1::sbuffer::expand_buffer(sbuffer *this,size_t len)

{
  bool bVar1;
  void *pvVar2;
  bad_alloc *this_00;
  long in_RSI;
  long *in_RDI;
  void *tmp;
  size_t tmp_nsize;
  size_t nsize;
  ulong local_38;
  ulong local_18;
  
  if (in_RDI[2] == 0) {
    local_38 = 0x2000;
  }
  else {
    local_38 = in_RDI[2] << 1;
  }
  local_18 = local_38;
  do {
    if ((ulong)(*in_RDI + in_RSI) <= local_18) goto LAB_00273518;
    bVar1 = local_18 < local_18 << 1;
    local_18 = local_18 << 1;
  } while (bVar1);
  local_18 = *in_RDI + in_RSI;
LAB_00273518:
  pvVar2 = realloc((void *)in_RDI[1],local_18);
  if (pvVar2 != (void *)0x0) {
    in_RDI[1] = (long)pvVar2;
    in_RDI[2] = local_18;
    return;
  }
  this_00 = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this_00);
  __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void expand_buffer(size_t len)
    {
        size_t nsize = (m_alloc > 0) ?
                m_alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < m_size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = m_size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        void* tmp = ::realloc(m_data, nsize);
        if(!tmp) {
            throw std::bad_alloc();
        }

        m_data = static_cast<char*>(tmp);
        m_alloc = nsize;
    }